

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeKindedSources(cmGeneratorTarget *this,KindedSources *files,string *config)

{
  cmake *this_00;
  long lVar1;
  cmSourceFile *pcVar2;
  cmGeneratorTarget *this_01;
  bool bVar3;
  string *psVar4;
  cmCustomCommand *pcVar5;
  ostream *poVar6;
  cmSourceFileLocation *pcVar7;
  SourceKind SVar8;
  pointer ppcVar9;
  pointer sourceName;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar10;
  cmSourceFile *sf;
  cmGeneratorTarget *local_370;
  SourceAndKind entry;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> badObjLib;
  string hFileName;
  string cppFileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  string ext;
  RegularExpression header_regex;
  
  srcs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  srcs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  srcs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetSourceFiles(this,&srcs,config);
  local_370 = this;
  cmsys::RegularExpression::RegularExpression
            (&header_regex,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &emitted._M_t._M_impl.super__Rb_tree_header._M_header;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       emitted._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (sourceName = srcs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      sourceName !=
      srcs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; sourceName = sourceName + 1) {
    sf = cmMakefile::GetOrCreateSource(local_370->Makefile,sourceName,false);
    pVar10 = std::
             _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
             ::_M_insert_unique<cmSourceFile*const&>
                       ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                         *)&emitted,&sf);
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      psVar4 = cmSourceFile::GetExtension_abi_cxx11_(sf);
      cmsys::SystemTools::LowerCase(&ext,psVar4);
      pcVar5 = cmSourceFile::GetCustomCommand(sf);
      pcVar2 = sf;
      SVar8 = SourceKindCustomCommand;
      if ((pcVar5 == (cmCustomCommand *)0x0) &&
         (SVar8 = SourceKindExtra, local_370->Target->TargetTypeValue != UTILITY)) {
        std::__cxx11::string::string((string *)&entry,"HEADER_FILE_ONLY",(allocator *)&hFileName);
        bVar3 = cmSourceFile::GetPropertyAsBool(pcVar2,(string *)&entry);
        std::__cxx11::string::~string((string *)&entry);
        pcVar2 = sf;
        SVar8 = SourceKindHeader;
        if (!bVar3) {
          std::__cxx11::string::string((string *)&entry,"EXTERNAL_OBJECT",(allocator *)&hFileName);
          bVar3 = cmSourceFile::GetPropertyAsBool(pcVar2,(string *)&entry);
          std::__cxx11::string::~string((string *)&entry);
          if (bVar3) {
            SVar8 = SourceKindExternalObject;
            if (local_370->Target->TargetTypeValue == OBJECT_LIBRARY) {
              std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                        (&badObjLib,&sf);
              SVar8 = SourceKindExternalObject;
            }
          }
          else {
            cmSourceFile::GetLanguage_abi_cxx11_((string *)&entry,sf);
            lVar1 = CONCAT44(entry._12_4_,entry.Kind);
            std::__cxx11::string::~string((string *)&entry);
            SVar8 = SourceKindObjectSource;
            if (lVar1 == 0) {
              bVar3 = std::operator==(&ext,"def");
              if (bVar3) {
                SVar8 = SourceKindModuleDefinition;
                if (local_370->Target->TargetTypeValue == OBJECT_LIBRARY) {
                  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                            (&badObjLib,&sf);
                  SVar8 = SourceKindModuleDefinition;
                }
              }
              else {
                bVar3 = std::operator==(&ext,"idl");
                if (bVar3) {
                  SVar8 = SourceKindIDL;
                  if (local_370->Target->TargetTypeValue == OBJECT_LIBRARY) {
                    std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
                              (&badObjLib,&sf);
                    SVar8 = SourceKindIDL;
                  }
                }
                else {
                  bVar3 = std::operator==(&ext,"resx");
                  if (bVar3) {
                    psVar4 = cmSourceFile::GetFullPath(sf,(string *)0x0);
                    std::__cxx11::string::string((string *)&entry,(string *)psVar4);
                    std::__cxx11::string::rfind((char)&entry,0x2e);
                    std::__cxx11::string::substr((ulong)&cppFileName,(ulong)&entry);
                    std::operator+(&hFileName,&cppFileName,".h");
                    std::__cxx11::string::~string((string *)&cppFileName);
                    std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)&files->ExpectedResxHeaders,&hFileName);
                    std::__cxx11::string::~string((string *)&hFileName);
                    std::__cxx11::string::~string((string *)&entry);
                    SVar8 = SourceKindResx;
                  }
                  else {
                    bVar3 = std::operator==(&ext,"appxmanifest");
                    SVar8 = SourceKindAppManifest;
                    if (!bVar3) {
                      bVar3 = std::operator==(&ext,"manifest");
                      SVar8 = SourceKindManifest;
                      if (!bVar3) {
                        bVar3 = std::operator==(&ext,"pfx");
                        SVar8 = SourceKindCertificate;
                        if (!bVar3) {
                          bVar3 = std::operator==(&ext,"xaml");
                          if (bVar3) {
                            psVar4 = cmSourceFile::GetFullPath(sf,(string *)0x0);
                            std::__cxx11::string::string((string *)&entry,(string *)psVar4);
                            std::operator+(&hFileName,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&entry,".h");
                            std::operator+(&cppFileName,
                                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)&entry,".cpp");
                            std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::_M_insert_unique<std::__cxx11::string_const&>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&files->ExpectedXamlHeaders,&hFileName);
                            std::
                            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            ::_M_insert_unique<std::__cxx11::string_const&>
                                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                        *)&files->ExpectedXamlSources,&cppFileName);
                            std::__cxx11::string::~string((string *)&cppFileName);
                            std::__cxx11::string::~string((string *)&hFileName);
                            std::__cxx11::string::~string((string *)&entry);
                            SVar8 = SourceKindXaml;
                          }
                          else {
                            psVar4 = cmSourceFile::GetFullPath(sf,(string *)0x0);
                            bVar3 = cmsys::RegularExpression::find
                                              (&header_regex,(psVar4->_M_dataplus)._M_p);
                            SVar8 = bVar3 | SourceKindExtra;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      entry.Source = sf;
      entry.Kind = SVar8;
      std::
      vector<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>::
      push_back(&files->Sources,(value_type *)&entry);
      std::__cxx11::string::~string((string *)&ext);
    }
  }
  if (badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&ext);
    poVar6 = std::operator<<((ostream *)&ext,"OBJECT library \"");
    this_01 = local_370;
    poVar6 = std::operator<<(poVar6,(string *)&local_370->Target->Name);
    std::operator<<(poVar6,"\" contains:\n");
    for (ppcVar9 = badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppcVar9 !=
        badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
      poVar6 = std::operator<<((ostream *)&ext,"  ");
      pcVar7 = cmSourceFile::GetLocation(*ppcVar9);
      poVar6 = std::operator<<(poVar6,(string *)&pcVar7->Name);
      std::operator<<(poVar6,"\n");
    }
    std::operator<<((ostream *)&ext,
                    "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
                   );
    this_00 = this_01->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    GetBacktrace((cmListFileBacktrace *)&hFileName,this_01);
    cmake::IssueMessage(this_00,FATAL_ERROR,(string *)&entry,(cmListFileBacktrace *)&hFileName);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&hFileName);
    std::__cxx11::string::~string((string *)&entry);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ext);
  }
  std::
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  ::~_Rb_tree(&emitted._M_t);
  std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
            (&badObjLib.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
  cmsys::RegularExpression::~RegularExpression(&header_regex);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&srcs);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeKindedSources(KindedSources& files,
                                             std::string const& config) const
{
  // Get the source file paths by string.
  std::vector<std::string> srcs;
  this->GetSourceFiles(srcs, config);

  cmsys::RegularExpression header_regex(CM_HEADER_REGEX);
  std::vector<cmSourceFile*> badObjLib;

  std::set<cmSourceFile*> emitted;
  for (std::vector<std::string>::const_iterator i = srcs.begin();
       i != srcs.end(); ++i) {
    // Create each source at most once.
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
    if (!emitted.insert(sf).second) {
      continue;
    }

    // Compute the kind (classification) of this source file.
    SourceKind kind;
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if (sf->GetCustomCommand()) {
      kind = SourceKindCustomCommand;
    } else if (this->Target->GetType() == cmStateEnums::UTILITY) {
      kind = SourceKindExtra;
    } else if (sf->GetPropertyAsBool("HEADER_FILE_ONLY")) {
      kind = SourceKindHeader;
    } else if (sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
      kind = SourceKindExternalObject;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (!sf->GetLanguage().empty()) {
      kind = SourceKindObjectSource;
    } else if (ext == "def") {
      kind = SourceKindModuleDefinition;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "idl") {
      kind = SourceKindIDL;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "resx") {
      kind = SourceKindResx;
      // Build and save the name of the corresponding .h file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string resx = sf->GetFullPath();
      std::string hFileName = resx.substr(0, resx.find_last_of('.')) + ".h";
      files.ExpectedResxHeaders.insert(hFileName);
    } else if (ext == "appxmanifest") {
      kind = SourceKindAppManifest;
    } else if (ext == "manifest") {
      kind = SourceKindManifest;
    } else if (ext == "pfx") {
      kind = SourceKindCertificate;
    } else if (ext == "xaml") {
      kind = SourceKindXaml;
      // Build and save the name of the corresponding .h and .cpp file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string xaml = sf->GetFullPath();
      std::string hFileName = xaml + ".h";
      std::string cppFileName = xaml + ".cpp";
      files.ExpectedXamlHeaders.insert(hFileName);
      files.ExpectedXamlSources.insert(cppFileName);
    } else if (header_regex.find(sf->GetFullPath().c_str())) {
      kind = SourceKindHeader;
    } else {
      kind = SourceKindExtra;
    }

    // Save this classified source file in the result vector.
    SourceAndKind entry = { sf, kind };
    files.Sources.push_back(entry);
  }

  if (!badObjLib.empty()) {
    std::ostringstream e;
    e << "OBJECT library \"" << this->GetName() << "\" contains:\n";
    for (std::vector<cmSourceFile*>::const_iterator i = badObjLib.begin();
         i != badObjLib.end(); ++i) {
      e << "  " << (*i)->GetLocation().GetName() << "\n";
    }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, e.str(), this->GetBacktrace());
  }
}